

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
UnExemptIRCCommand::trigger
          (UnExemptIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  unsigned_long uVar2;
  long *plVar3;
  char *pcVar4;
  string_view in_string;
  undefined8 uStack_30;
  
  in_string._M_str = (char *)channel._M_len;
  if (parameters._M_len == 0) {
    pcVar4 = "Error: Too Few Parameters. Syntax: unexempt <Exemption ID>";
    uStack_30 = 0x3a;
  }
  else {
    in_string._M_len = (size_t)parameters._M_str;
    uVar2 = Jupiter::from_string<unsigned_long>((Jupiter *)parameters._M_len,in_string);
    plVar3 = (long *)RenX::ExemptionDatabase::getEntries();
    if (uVar2 < (ulong)(plVar3[1] - *plVar3 >> 3)) {
      cVar1 = RenX::ExemptionDatabase::deactivate(RenX::exemptionDatabase);
      if (cVar1 == '\0') {
        pcVar4 = "Error: Exemption not active.";
        uStack_30 = 0x1c;
      }
      else {
        pcVar4 = "Exemption deactivated.";
        uStack_30 = 0x16;
      }
    }
    else {
      pcVar4 = "Error: Invalid exemption ID; please find the exemption ID using \"esearch\".";
      uStack_30 = 0x4a;
    }
  }
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uStack_30,pcVar4);
  return;
}

Assistant:

void UnExemptIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		size_t index = Jupiter::from_string<size_t>(parameters);
		if (index < RenX::exemptionDatabase->getEntries().size())
		{
			if (RenX::exemptionDatabase->deactivate(index))
				source->sendNotice(nick, "Exemption deactivated."sv);
			else
				source->sendNotice(nick, "Error: Exemption not active."sv);
		}
		else
			source->sendNotice(nick, "Error: Invalid exemption ID; please find the exemption ID using \"esearch\"."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: unexempt <Exemption ID>"sv);
}